

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
funnyStrings_outofrange_Test::~funnyStrings_outofrange_Test(funnyStrings_outofrange_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(funnyStrings, outofrange)
{  // these are mainly testing that it doesn't throw
    EXPECT_FALSE(
        isfinite(unit_from_string("1532^34e505")));  // out of range error
    EXPECT_TRUE(isinf(unit_from_string("34e505")));  // out of range
    EXPECT_TRUE(isinf(unit_from_string("-34e505")));  // out of range

    EXPECT_TRUE(isinf(
        unit_from_string("34.785e12458")));  // out of range of quad precision
}